

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

uint * Gia_ManTerStateLookup(uint *pState,int nWords,uint **pBins,int nBins)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint *__s1;
  
  if (nWords < 1) {
    uVar1 = 0;
  }
  else {
    uVar3 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 ^ Gia_ManTerStateHash::s_FPrimes[(uint)uVar3 & 0x7f] * pState[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)nWords != uVar3);
  }
  __s1 = pBins[(int)(uVar1 % (uint)nBins)];
  if (__s1 != (uint *)0x0) {
    do {
      iVar2 = bcmp(__s1,pState,(long)nWords * 4);
      if (iVar2 == 0) {
        return __s1;
      }
      __s1 = *(uint **)(__s1 + nWords);
    } while (__s1 != (uint *)0x0);
  }
  return (uint *)0x0;
}

Assistant:

unsigned * Gia_ManTerStateLookup( unsigned * pState, int nWords, unsigned ** pBins, int nBins )
{
    unsigned * pEntry;
    int Hash = Gia_ManTerStateHash( pState, nWords, nBins );
    for ( pEntry = pBins[Hash]; pEntry; pEntry = Gia_ManTerStateNext(pEntry, nWords) )
        if ( !memcmp( pEntry, pState, sizeof(unsigned) * nWords ) )
            return pEntry;
    return NULL;
}